

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void readString(bool raw)

{
  char cVar1;
  LexerState *pLVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  pLVar2 = lexerState;
  pLVar2->disableMacroArgs = true;
  pLVar2->disableInterpolation = true;
  iVar3 = peek();
  if (iVar3 == 0x22) {
    shiftChar();
    iVar4 = peek();
    if (iVar4 != 0x22) {
      uVar7 = 0;
      goto LAB_0010d98d;
    }
    shiftChar();
  }
  uVar7 = 0;
LAB_0010d739:
  while( true ) {
    iVar4 = peek();
    if ((iVar4 == -1) || ((iVar3 != 0x22 && ((iVar4 == 0xd || (iVar4 == 10)))))) goto LAB_0010d95a;
    shiftChar();
    if (iVar4 == 0x22) {
      if (iVar3 == 0x22) {
        iVar4 = peek();
        if (iVar4 != 0x22) goto LAB_0010d7f0;
        shiftChar();
        iVar4 = peek();
        if (iVar4 != 0x22) goto code_r0x0010d7db;
        shiftChar();
      }
      goto LAB_0010d968;
    }
    if (iVar4 != 0x5c) break;
    if (raw) {
LAB_0010d93b:
      iVar4 = 0x5c;
      goto LAB_0010d941;
    }
    iVar4 = peek();
    uVar5 = (ulong)(iVar4 - 0x30U);
    if (iVar4 - 0x30U < 0x3f) {
      if ((0x113ffUL >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 == 0x2c) goto LAB_0010d90a;
        if (uVar5 != 0x3e) goto LAB_0010d8b1;
        shiftChar();
LAB_0010d844:
        iVar4 = 10;
        goto LAB_0010d941;
      }
LAB_0010d7a0:
      shiftChar();
      pcVar6 = readMacroArg((char)iVar4);
      if (pcVar6 != (char *)0x0) {
        while (cVar1 = *pcVar6, cVar1 != '\0') {
          pcVar6 = pcVar6 + 1;
          if (uVar7 < 0x100) {
            yylval.symName[uVar7] = cVar1;
            uVar7 = uVar7 + 1;
          }
        }
      }
    }
    else {
LAB_0010d8b1:
      if (((iVar4 != 10) && (iVar4 != 0xd)) && (iVar4 != 0x20)) {
        if (iVar4 == 0x23) goto LAB_0010d7a0;
        if (iVar4 == -1) {
          error("Illegal character escape at end of input\n");
          goto LAB_0010d93b;
        }
        if (iVar4 == 0x22) {
LAB_0010d90a:
          shiftChar();
        }
        else if (iVar4 == 0x72) {
          shiftChar();
          iVar4 = 0xd;
        }
        else {
          if (iVar4 != 0x74) {
            if ((iVar4 != 0x7d) && (iVar4 != 0x7b)) {
              pcVar6 = printChar(iVar4);
              error("Illegal character escape %s\n",pcVar6);
            }
            goto LAB_0010d90a;
          }
          shiftChar();
          iVar4 = 9;
        }
        goto LAB_0010d941;
      }
      readLineContinuation();
    }
  }
  if (iVar4 == 10) {
LAB_0010d82b:
    handleCRLF(iVar4);
    pLVar2 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar2->colNo = 1;
    goto LAB_0010d844;
  }
  if (iVar4 == 0x7b) {
    if (!raw) {
      lexerState->disableMacroArgs = false;
      pcVar6 = readInterpolation(0);
      if (pcVar6 != (char *)0x0) {
        while (cVar1 = *pcVar6, cVar1 != '\0') {
          pcVar6 = pcVar6 + 1;
          if (uVar7 < 0x100) {
            yylval.symName[uVar7] = cVar1;
            uVar7 = uVar7 + 1;
          }
        }
      }
      lexerState->disableMacroArgs = true;
      goto LAB_0010d739;
    }
    iVar4 = 0x7b;
  }
  else if (iVar4 == 0xd) goto LAB_0010d82b;
  goto LAB_0010d941;
code_r0x0010d7db:
  if (0xff < uVar7) goto LAB_0010d739;
  yylval.symName[uVar7] = '\"';
  uVar7 = uVar7 + 1;
LAB_0010d7f0:
  iVar4 = 0x22;
LAB_0010d941:
  if (uVar7 < 0x100) {
    yylval.symName[uVar7] = (char)iVar4;
    uVar7 = uVar7 + 1;
  }
  goto LAB_0010d739;
LAB_0010d95a:
  error("Unterminated string\n");
LAB_0010d968:
  if (uVar7 == 0x100) {
    warning(WARNING_LONG_STR,"String constant too long\n");
    uVar7 = 0xff;
  }
LAB_0010d98d:
  yylval.symName[uVar7] = '\0';
  pLVar2 = lexerState;
  pLVar2->disableMacroArgs = false;
  pLVar2->disableInterpolation = false;
  return;
}

Assistant:

static void readString(bool raw)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	size_t i = 0;
	bool multiline = false;
	char const *str;

	// We reach this function after reading a single quote, but we also support triple quotes
	if (peek() == '"') {
		shiftChar();
		if (peek() == '"') {
			// """ begins a multi-line string
			shiftChar();
			multiline = true;
		} else {
			// "" is an empty string, skip the loop
			goto finish;
		}
	}

	for (;;) {
		int c = peek();

		// '\r', '\n' or EOF ends a single-line string early
		if (c == EOF || (!multiline && (c == '\r' || c == '\n'))) {
			error("Unterminated string\n");
			break;
		}

		// We'll be staying in the string, so we can safely consume the char
		shiftChar();

		// Handle '\r' or '\n' (in multiline strings only, already handled above otherwise)
		if (c == '\r' || c == '\n') {
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			nextLine();
			c = '\n';
		}

		switch (c) {
		case '"':
			if (multiline) {
				// Only """ ends a multi-line string
				if (peek() != '"')
					break;
				shiftChar();
				if (peek() != '"') {
					append_yylval_string('"');
					break;
				}
				shiftChar();
			}
			goto finish;

		case '\\': // Character escape or macro arg
			if (raw)
				break;
			c = peek();
			switch (c) {
			case '\\':
			case '"':
			case '{':
			case '}':
				// Return that character unchanged
				shiftChar();
				break;
			case 'n':
				c = '\n';
				shiftChar();
				break;
			case 'r':
				c = '\r';
				shiftChar();
				break;
			case 't':
				c = '\t';
				shiftChar();
				break;

			// Line continuation
			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			// Macro arg
			case '@':
			case '#':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '<':
				shiftChar();
				str = readMacroArg(c);
				if (str) {
					while (*str)
						append_yylval_string(*str++);
				}
				continue; // Do not copy an additional character

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			default:
				error("Illegal character escape %s\n", printChar(c));
				shiftChar();
				break;
			}
			break;

		case '{': // Symbol interpolation
			if (raw)
				break;
			// We'll be exiting the string scope, so re-enable expansions
			// (Not interpolations, since they're handled by the function itself...)
			lexerState->disableMacroArgs = false;
			str = readInterpolation(0);
			if (str) {
				while (*str)
					append_yylval_string(*str++);
			}
			lexerState->disableMacroArgs = true;
			continue; // Do not copy an additional character

		// Regular characters will just get copied
		}

		append_yylval_string(c);
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "String constant too long\n");
	}
	yylval.string[i] = '\0';

	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}